

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O0

Data * __thiscall DL::DataGroup::at(Data *__return_storage_ptr__,DataGroup *this,size_t i)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  allocator local_41;
  string local_40 [32];
  ulong local_20;
  size_t i_local;
  DataGroup *this_local;
  
  local_20 = i;
  i_local = (size_t)this;
  this_local = (DataGroup *)__return_storage_ptr__;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  uVar1 = local_20;
  if (!bVar2) {
    __assert_fail("(mShared)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataGroup.cpp"
                  ,0x72,"Data DL::DataGroup::at(size_t) const");
  }
  peVar3 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  sVar4 = std::vector<DL::Data,_std::allocator<DL::Data>_>::size(&peVar3->AnonymousData);
  if (uVar1 < sVar4) {
    peVar3 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pvVar5 = std::vector<DL::Data,_std::allocator<DL::Data>_>::at(&peVar3->AnonymousData,local_20);
    Data::Data(__return_storage_ptr__,pvVar5);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    Data::Data(__return_storage_ptr__,(string_t *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Data DataGroup::at(size_t i) const
{
	DL_ASSERT(mShared);

	if (i < mShared->AnonymousData.size())
		return mShared->AnonymousData.at(i);
	else
		return Data();
}